

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O2

char * lj_str_pushvf(lua_State *L,char *fmt,__va_list_tag *argp)

{
  SBuf *sb;
  char cVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  long *plVar5;
  int32_t *piVar6;
  ulong *puVar7;
  TValue *pTVar8;
  int *piVar9;
  ulong uVar10;
  size_t sVar11;
  GCstr *pGVar12;
  MSize len;
  int c;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  char *s;
  TValue tv;
  char buf [11];
  undefined1 local_4d [29];
  
  uVar15 = (ulong)(L->glref).ptr32;
  sb = (SBuf *)(uVar15 + 0x58);
  sVar3 = strlen(fmt);
  lj_str_needbuf(L,sb,(MSize)sVar3);
  *(undefined4 *)(uVar15 + 0x60) = 0;
  do {
    pcVar4 = strchr(fmt,0x25);
    if (pcVar4 == (char *)0x0) {
      sVar3 = strlen(fmt);
      addstr(L,sb,fmt,(MSize)sVar3);
      pTVar8 = L->top;
      pGVar12 = lj_str_new(L,*(char **)(uVar15 + 0x58),(ulong)*(uint *)(uVar15 + 0x60));
      (pTVar8->u32).lo = (uint32_t)pGVar12;
      (pTVar8->field_2).it = 0xfffffffb;
      pTVar8 = L->top + 1;
      L->top = pTVar8;
      if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar8) {
        lj_state_growstack1(L);
        pTVar8 = L->top;
      }
      return (char *)((ulong)pTVar8[-1].u32.lo + 0x10);
    }
    addstr(L,sb,fmt,(int)pcVar4 - (int)fmt);
    cVar1 = pcVar4[1];
    if (cVar1 == '%') {
      c = 0x25;
LAB_00108b8e:
      addchar(L,sb,c);
    }
    else {
      if (cVar1 == 'c') {
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          piVar9 = (int *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          piVar9 = (int *)argp->overflow_arg_area;
          argp->overflow_arg_area = piVar9 + 2;
        }
        c = *piVar9;
        goto LAB_00108b8e;
      }
      if (cVar1 == 'd') {
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          piVar6 = (int32_t *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          piVar6 = (int32_t *)argp->overflow_arg_area;
          argp->overflow_arg_area = piVar6 + 2;
        }
        s = lj_str_bufint(buf,*piVar6);
        len = (int)local_4d - (int)s;
      }
      else if (cVar1 == 'f') {
        uVar2 = argp->fp_offset;
        if ((ulong)uVar2 < 0xa1) {
          pTVar8 = (TValue *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->fp_offset = uVar2 + 0x10;
        }
        else {
          pTVar8 = (TValue *)argp->overflow_arg_area;
          argp->overflow_arg_area = pTVar8 + 1;
        }
        tv = *pTVar8;
        s = buf;
        sVar11 = lj_str_bufnum(s,&tv);
        len = (MSize)sVar11;
      }
      else if (cVar1 == 'p') {
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar7 = (ulong *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          puVar7 = (ulong *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar7 + 1;
        }
        uVar10 = *puVar7;
        if (uVar10 == 0) {
          s = "NULL";
          len = 4;
        }
        else {
          len = 10;
          if (uVar10 >> 0x20 != 0) {
            uVar2 = 0x1f;
            uVar13 = (uint)(uVar10 >> 0x20);
            if (uVar13 != 0) {
              for (; uVar13 >> uVar2 == 0; uVar2 = uVar2 - 1) {
              }
            }
            len = (uVar2 >> 2 & 6) + 0xc;
          }
          buf[0] = '0';
          buf[1] = 'x';
          for (uVar14 = (ulong)len; 2 < (long)uVar14; uVar14 = uVar14 - 1) {
            buf[uVar14 - 1] = "0123456789abcdef"[(uint)uVar10 & 0xf];
            uVar10 = (long)uVar10 >> 4;
          }
          s = buf;
        }
      }
      else {
        if (cVar1 != 's') {
          addchar(L,sb,0x25);
          c = (int)pcVar4[1];
          goto LAB_00108b8e;
        }
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          plVar5 = (long *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          plVar5 = (long *)argp->overflow_arg_area;
          argp->overflow_arg_area = plVar5 + 1;
        }
        s = (char *)*plVar5;
        if (s == (char *)0x0) {
          s = "(null)";
        }
        sVar3 = strlen(s);
        len = (MSize)sVar3;
      }
      addstr(L,sb,s,len);
    }
    fmt = pcVar4 + 2;
  } while( true );
}

Assistant:

const char *lj_str_pushvf(lua_State *L, const char *fmt, va_list argp)
{
  SBuf *sb = &G(L)->tmpbuf;
  lj_str_needbuf(L, sb, (MSize)strlen(fmt));
  lj_str_resetbuf(sb);
  for (;;) {
    const char *e = strchr(fmt, '%');
    if (e == NULL) break;
    addstr(L, sb, fmt, (MSize)(e-fmt));
    /* This function only handles %s, %c, %d, %f and %p formats. */
    switch (e[1]) {
    case 's': {
      const char *s = va_arg(argp, char *);
      if (s == NULL) s = "(null)";
      addstr(L, sb, s, (MSize)strlen(s));
      break;
      }
    case 'c':
      addchar(L, sb, va_arg(argp, int));
      break;
    case 'd': {
      char buf[LJ_STR_INTBUF];
      char *p = lj_str_bufint(buf, va_arg(argp, int32_t));
      addstr(L, sb, p, (MSize)(buf+LJ_STR_INTBUF-p));
      break;
      }
    case 'f': {
      char buf[LJ_STR_NUMBUF];
      TValue tv;
      MSize len;
      tv.n = (lua_Number)(va_arg(argp, LUAI_UACNUMBER));
      len = (MSize)lj_str_bufnum(buf, &tv);
      addstr(L, sb, buf, len);
      break;
      }
    case 'p': {
#define FMTP_CHARS	(2*sizeof(ptrdiff_t))
      char buf[2+FMTP_CHARS];
      ptrdiff_t p = (ptrdiff_t)(va_arg(argp, void *));
      ptrdiff_t i, lasti = 2+FMTP_CHARS;
      if (p == 0) {
	addstr(L, sb, "NULL", 4);
	break;
      }
#if LJ_64
      /* Shorten output for 64 bit pointers. */
      lasti = 2+2*4+((p >> 32) ? 2+2*(lj_fls((uint32_t)(p >> 32))>>3) : 0);
#endif
      buf[0] = '0';
      buf[1] = 'x';
      for (i = lasti-1; i >= 2; i--, p >>= 4)
	buf[i] = "0123456789abcdef"[(p & 15)];
      addstr(L, sb, buf, (MSize)lasti);
      break;
      }
    case '%':
      addchar(L, sb, '%');
      break;
    default:
      addchar(L, sb, '%');
      addchar(L, sb, e[1]);
      break;
    }
    fmt = e+2;
  }
  addstr(L, sb, fmt, (MSize)strlen(fmt));
  setstrV(L, L->top, lj_str_new(L, sb->buf, sb->n));
  incr_top(L);
  return strVdata(L->top - 1);
}